

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeShaderBuiltinVarTests.cpp
# Opt level: O0

int __thiscall
vkt::compute::anon_unknown_0::ComputeShaderBuiltinVarTests::init
          (ComputeShaderBuiltinVarTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  TestContext *pTVar2;
  ComputeShaderBuiltinVarTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0xb0);
  pTVar2 = tcu::TestNode::getTestContext((TestNode *)this);
  NumWorkGroupsCase::NumWorkGroupsCase((NumWorkGroupsCase *)pTVar1,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xb0);
  pTVar2 = tcu::TestNode::getTestContext((TestNode *)this);
  WorkGroupSizeCase::WorkGroupSizeCase((WorkGroupSizeCase *)pTVar1,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xb0);
  pTVar2 = tcu::TestNode::getTestContext((TestNode *)this);
  WorkGroupIDCase::WorkGroupIDCase((WorkGroupIDCase *)pTVar1,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xb0);
  pTVar2 = tcu::TestNode::getTestContext((TestNode *)this);
  LocalInvocationIDCase::LocalInvocationIDCase((LocalInvocationIDCase *)pTVar1,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xb0);
  pTVar2 = tcu::TestNode::getTestContext((TestNode *)this);
  GlobalInvocationIDCase::GlobalInvocationIDCase((GlobalInvocationIDCase *)pTVar1,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xb0);
  pTVar2 = tcu::TestNode::getTestContext((TestNode *)this);
  LocalInvocationIndexCase::LocalInvocationIndexCase((LocalInvocationIndexCase *)pTVar1,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void ComputeShaderBuiltinVarTests::init (void)
{
	addChild(new NumWorkGroupsCase(this->getTestContext()));
	addChild(new WorkGroupSizeCase(this->getTestContext()));
	addChild(new WorkGroupIDCase(this->getTestContext()));
	addChild(new LocalInvocationIDCase(this->getTestContext()));
	addChild(new GlobalInvocationIDCase(this->getTestContext()));
	addChild(new LocalInvocationIndexCase(this->getTestContext()));
}